

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
* __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::operator=(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            *this,InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *other)

{
  size_t sVar1;
  ParsedParameter **ppPVar2;
  int i;
  size_t sVar3;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  
  if (this != other) {
    this->nStored = 0;
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      ppPVar2 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = ppPVar2;
      sVar1 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar1;
      sVar1 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar1;
      sVar1 = this->nStored;
      if ((sVar1 != 0) && (this->ptr == (ParsedParameter **)0x0)) {
        sVar3 = 0;
        do {
          *(undefined8 *)((long)&this->field_2 + sVar3 * 8) =
               *(undefined8 *)((long)&other->field_2 + sVar3 * 8);
          sVar3 = sVar3 + 1;
        } while (sVar1 != sVar3);
        other->nStored = sVar1;
      }
    }
    else {
      reserve(this,other->nStored);
      sVar1 = other->nStored;
      if (sVar1 != 0) {
        sVar3 = 0;
        do {
          paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                    *)this->ptr;
          if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
               *)this->ptr ==
              (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
               *)0x0) {
            paVar4 = &this->field_2;
          }
          paVar5 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                    *)other->ptr;
          if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
               *)other->ptr ==
              (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
               *)0x0) {
            paVar5 = &other->field_2;
          }
          paVar4->fixed[sVar3] = paVar5->fixed[sVar3];
          sVar3 = sVar3 + 1;
        } while (sVar1 != sVar3);
      }
      this->nStored = sVar1;
    }
  }
  return this;
}

Assistant:

InlinedVector &operator=(InlinedVector &&other) {
        if (this == &other)
            return *this;

        clear();
        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
            if (nStored > 0 && ptr == nullptr) {
                for (int i = 0; i < nStored; ++i)
                    alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
                other.nStored = nStored;  // so that dtors run...
            }
        } else {
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(begin() + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }